

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Add<google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *prototype)

{
  int iVar1;
  Arena *in_RDI;
  Type *result;
  SentencePieceText *in_stack_ffffffffffffffe0;
  Type *local_8;
  
  if ((*(long *)(in_RDI + 0x10) == 0) || (**(int **)(in_RDI + 0x10) <= *(int *)(in_RDI + 8))) {
    if ((*(long *)(in_RDI + 0x10) == 0) || (**(int **)(in_RDI + 0x10) == *(int *)(in_RDI + 0xc))) {
      Reserve((RepeatedPtrFieldBase *)in_stack_ffffffffffffffe0,(int)((ulong)in_RDI >> 0x20));
    }
    **(int **)(in_RDI + 0x10) = **(int **)(in_RDI + 0x10) + 1;
    local_8 = GenericTypeHandler<sentencepiece::SentencePieceText>::NewFromPrototype
                        (in_stack_ffffffffffffffe0,in_RDI);
    iVar1 = *(int *)(in_RDI + 8);
    *(int *)(in_RDI + 8) = iVar1 + 1;
    *(Type **)(*(long *)(in_RDI + 0x10) + 8 + (long)iVar1 * 8) = local_8;
  }
  else {
    iVar1 = *(int *)(in_RDI + 8);
    *(int *)(in_RDI + 8) = iVar1 + 1;
    local_8 = cast<google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText>::TypeHandler>
                        (*(void **)(*(long *)(in_RDI + 0x10) + 8 + (long)iVar1 * 8));
  }
  return local_8;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::Add(
    typename TypeHandler::Type* prototype) {
  if (rep_ != NULL && current_size_ < rep_->allocated_size) {
    return cast<TypeHandler>(rep_->elements[current_size_++]);
  }
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  ++rep_->allocated_size;
  typename TypeHandler::Type* result =
      TypeHandler::NewFromPrototype(prototype, arena_);
  rep_->elements[current_size_++] = result;
  return result;
}